

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

BinaryExpr<const_frozen::basic_string<wchar_t>_&,_const_wchar_t_(&)[12]> * __thiscall
Catch::ExprLhs<frozen::basic_string<wchar_t>const&>::operator==
          (BinaryExpr<const_frozen::basic_string<wchar_t>_&,_const_wchar_t_(&)[12]>
           *__return_storage_ptr__,ExprLhs<frozen::basic_string<wchar_t>const&> *this,
          wchar_t (*rhs) [12])

{
  basic_string<wchar_t> *lhs;
  bool comparisonResult;
  StringRef local_30;
  wchar_t (*local_20) [12];
  wchar_t (*rhs_local) [12];
  ExprLhs<const_frozen::basic_string<wchar_t>_&> *this_local;
  
  local_20 = rhs;
  rhs_local = (wchar_t (*) [12])this;
  this_local = (ExprLhs<const_frozen::basic_string<wchar_t>_&> *)__return_storage_ptr__;
  comparisonResult =
       compareEqual<frozen::basic_string<wchar_t>,wchar_t[12]>(*(basic_string<wchar_t> **)this,rhs);
  lhs = *(basic_string<wchar_t> **)this;
  StringRef::StringRef(&local_30,"==");
  BinaryExpr<const_frozen::basic_string<wchar_t>_&,_const_wchar_t_(&)[12]>::BinaryExpr
            (__return_storage_ptr__,comparisonResult,lhs,local_30,local_20);
  return __return_storage_ptr__;
}

Assistant:

auto operator == ( RhsT const& rhs ) -> BinaryExpr<LhsT, RhsT const&> const {
            return { compareEqual( m_lhs, rhs ), m_lhs, "==", rhs };
        }